

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blip_Buffer.cpp
# Opt level: O3

void __thiscall Blip_Impulse_::volume_unit(Blip_Impulse_ *this,double new_unit)

{
  uint uVar1;
  double dVar2;
  blip_eq_t local_20;
  
  if ((this->volume_unit_ == new_unit) && (!NAN(this->volume_unit_) && !NAN(new_unit))) {
    return;
  }
  if (this->generate == true) {
    local_20.treble = -8.87;
    local_20.cutoff = 0x2260;
    local_20.sample_rate = 0xac44;
    treble_eq(this,&local_20);
  }
  this->volume_unit_ = new_unit;
  dVar2 = floor(new_unit * 65536.0 + 0.5);
  uVar1 = ((uint)(long)dVar2 |
          (uint)(long)(dVar2 - 9.223372036854776e+18) & (uint)((long)dVar2 >> 0x3f)) * 0x10001;
  this->offset = uVar1;
  if (this->fine_bits != 0) {
    fine_volume_unit(this);
    return;
  }
  scale_impulse(this,uVar1 & 0xffff,this->impulses);
  return;
}

Assistant:

void Blip_Impulse_::volume_unit( double new_unit )
{
	if ( new_unit == volume_unit_ )
		return;
	
	if ( generate )
		treble_eq( blip_eq_t( -8.87, 8800, 44100 ) );
	
	volume_unit_ = new_unit;
	
	offset = 0x10001 * (unsigned long) floor( volume_unit_ * 0x10000 + 0.5 );
	
	if ( fine_bits )
		fine_volume_unit();
	else
		scale_impulse( offset & 0xffff, impulses );
}